

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

default_cost_type<double> __thiscall
baryonyx::itm::normalize_costs<double,baryonyx::itm::default_cost_type<double>>
          (itm *this,context *ctx,default_cost_type<double> *c,random_engine *rng,int n)

{
  tuple<double_*,_std::default_delete<double[]>_> extraout_RDX;
  tuple<double_*,_std::default_delete<double[]>_> extraout_RDX_00;
  tuple<double_*,_std::default_delete<double[]>_> extraout_RDX_01;
  tuple<double_*,_std::default_delete<double[]>_> extraout_RDX_02;
  __uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true> extraout_RDX_03;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> _Var1;
  default_cost_type<double> dVar2;
  
  default_cost_type<double>::default_cost_type((default_cost_type<double> *)this,c,n);
  switch((ctx->parameters).cost_norm) {
  case none:
    info<>(ctx,"  - No norm");
    _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (tuple<double_*,_std::default_delete<double[]>_>)
         extraout_RDX.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    break;
  case random:
    info<>(ctx,"  - Compute random norm\n");
    default_cost_type<double>::
    make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              ((default_cost_type<double> *)this,n,rng);
    _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (tuple<double_*,_std::default_delete<double[]>_>)
         extraout_RDX_02.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    break;
  case l1:
    info<>(ctx,"  - Compute l1 norm\n");
    default_cost_type<double>::make_l1_norm((default_cost_type<double> *)this,n);
    _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (tuple<double_*,_std::default_delete<double[]>_>)
         extraout_RDX_00.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    break;
  case l2:
    info<>(ctx,"  - Compute l2 norm\n");
    default_cost_type<double>::make_l2_norm((default_cost_type<double> *)this,n);
    _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (tuple<double_*,_std::default_delete<double[]>_>)
         extraout_RDX_01.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    break;
  default:
    info<>(ctx,"  - Compute infinity-norm (default)\n");
    default_cost_type<double>::make_loo_norm((default_cost_type<double> *)this,n);
    _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (tuple<double_*,_std::default_delete<double[]>_>)
         extraout_RDX_03.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
  }
  dVar2.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       _Var1._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  dVar2.obj = (objective_function *)this;
  return dVar2;
}

Assistant:

inline Cost
normalize_costs(const context& ctx, const Cost& c, random_engine& rng, int n)
{
    Cost ret(c, n);

    switch (ctx.parameters.cost_norm) {
    case solver_parameters::cost_norm_type::none:
        info(ctx, "  - No norm");
        return ret;

    case solver_parameters::cost_norm_type::random:
        info(ctx, "  - Compute random norm\n");
        ret.make_random_norm(n, rng);
        return ret;

    case solver_parameters::cost_norm_type::l1:
        info(ctx, "  - Compute l1 norm\n");
        ret.make_l1_norm(n);
        return ret;

    case solver_parameters::cost_norm_type::l2:
        info(ctx, "  - Compute l2 norm\n");
        ret.make_l2_norm(n);
        return ret;

    default:
        info(ctx, "  - Compute infinity-norm (default)\n");
        ret.make_loo_norm(n);
        return ret;
    }
}